

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O3

int libssh2_userauth_hostbased_fromfile_ex
              (LIBSSH2_SESSION *session,char *user,uint user_len,char *publickey,char *privatekey,
              char *passphrase,char *host,uint host_len,char *localuser,uint localuser_len)

{
  uchar **data;
  long lVar1;
  libssh2_nonblocking_states lVar2;
  _func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *p_Var3;
  uchar **ppuVar4;
  LIBSSH2_HOSTKEY_METHOD *pLVar5;
  int iVar6;
  time_t start_time;
  uchar *puVar7;
  char *errmsg;
  size_t sVar8;
  long lVar9;
  uchar *sig;
  void *abstract;
  LIBSSH2_HOSTKEY_METHOD *privkeyobj;
  uchar buf [5];
  iovec datavec [4];
  size_t local_f8;
  uchar *local_f0;
  size_t local_e8;
  uchar *local_e0;
  void *local_d8;
  uchar **local_d0;
  char *local_c8;
  char *local_c0;
  size_t *local_b8;
  uchar **local_b0;
  packet_requirev_state_t *local_a8;
  ulong local_a0;
  char *local_98;
  char *local_90;
  LIBSSH2_HOSTKEY_METHOD *local_88;
  uchar local_7d [5];
  iovec local_78;
  uchar *local_68;
  ulong local_60;
  uchar *local_58;
  size_t local_50;
  
  local_c8 = privatekey;
  local_c0 = passphrase;
  local_98 = user;
  local_90 = publickey;
  start_time = time((time_t *)0x0);
  local_a0 = (ulong)user_len;
  local_a8 = &session->userauth_host_packet_requirev_state;
  local_b0 = &session->userauth_host_method;
  local_b8 = &session->userauth_host_method_len;
  lVar9 = host_len + local_a0;
  local_d0 = &session->userauth_host_s;
  data = &session->userauth_host_data;
  do {
    lVar2 = session->userauth_host_state;
    if (lVar2 == libssh2_NB_state_sent) {
LAB_00128f3d:
      iVar6 = _libssh2_packet_requirev
                        (session,"43",data,(size_t *)&local_78,0,(uchar *)0x0,0,local_a8);
      if (iVar6 == -0x25) {
LAB_00128f74:
        iVar6 = -0x25;
        errmsg = "Would block";
        goto LAB_00128fd9;
      }
      session->userauth_host_state = libssh2_NB_state_idle;
      if ((iVar6 != 0) || ((uchar *)local_78.iov_base == (uchar *)0x0)) {
        iVar6 = -0x13;
        errmsg = "Auth failed";
        goto LAB_00128fd9;
      }
      puVar7 = *data;
      if (*puVar7 != '4') goto LAB_00128ae4;
      (*session->free)(puVar7,&session->abstract);
      session->userauth_host_data = (uchar *)0x0;
      *(byte *)&session->state = (byte)session->state | 4;
      iVar6 = 0;
    }
    else {
      if (lVar2 == libssh2_NB_state_created) {
LAB_00128eb6:
        iVar6 = _libssh2_transport_send
                          (session,session->userauth_host_packet,
                           (long)session->userauth_host_s - (long)session->userauth_host_packet,
                           (uchar *)0x0,0);
        if (iVar6 == 0) {
          (*session->free)(session->userauth_host_packet,&session->abstract);
          session->userauth_host_packet = (uchar *)0x0;
          session->userauth_host_state = libssh2_NB_state_sent;
          goto LAB_00128f3d;
        }
        if (iVar6 == -0x25) goto LAB_00128f74;
        (*session->free)(session->userauth_host_packet,&session->abstract);
        session->userauth_host_packet = (uchar *)0x0;
        session->userauth_host_state = libssh2_NB_state_idle;
        iVar6 = -7;
        errmsg = "Unable to send userauth-hostbased request";
      }
      else {
        if (lVar2 == libssh2_NB_state_idle) {
          local_f0 = (uchar *)0x0;
          local_e0 = (uchar *)0x0;
          local_f8 = 0;
          local_e8 = 0;
          local_a8->start = 0;
          if (local_90 == (char *)0x0) {
            iVar6 = _libssh2_pub_priv_keyfile
                              (session,local_b0,local_b8,&local_f0,&local_f8,local_c8,local_c0);
          }
          else {
            iVar6 = file_read_publickey(session,local_b0,local_b8,&local_f0,&local_f8,local_90);
          }
          if (iVar6 == 0) {
            lVar1 = lVar9 + (ulong)localuser_len + session->userauth_host_method_len;
            session->userauth_host_packet_len = local_f8 + lVar1 + 0x34;
            puVar7 = (uchar *)(*session->alloc)(local_f8 * 2 + session->userauth_host_method_len +
                                                lVar1 + 0x40,&session->abstract);
            ppuVar4 = local_d0;
            session->userauth_host_packet = puVar7;
            session->userauth_host_s = puVar7;
            if (puVar7 == (uchar *)0x0) {
              (*session->free)(session->userauth_host_method,&session->abstract);
              session->userauth_host_method = (uchar *)0x0;
              (*session->free)(local_f0,&session->abstract);
              iVar6 = -6;
              errmsg = "Out of memory";
              goto LAB_00128fd9;
            }
            session->userauth_host_s = puVar7 + 1;
            *puVar7 = '2';
            _libssh2_store_str(local_d0,local_98,local_a0);
            _libssh2_store_str(ppuVar4,"ssh-connection",0xe);
            _libssh2_store_str(ppuVar4,"hostbased",9);
            _libssh2_store_str(ppuVar4,(char *)session->userauth_host_method,
                               session->userauth_host_method_len);
            _libssh2_store_str(ppuVar4,(char *)local_f0,local_f8);
            (*session->free)(local_f0,&session->abstract);
            _libssh2_store_str(ppuVar4,host,(ulong)host_len);
            _libssh2_store_str(ppuVar4,localuser,(ulong)localuser_len);
            iVar6 = file_read_privatekey
                              (session,&local_88,&local_d8,session->userauth_host_method,
                               session->userauth_host_method_len,local_c8,local_c0);
            if (iVar6 == 0) {
              _libssh2_htonu32(local_7d,session->session_id_len);
              pLVar5 = local_88;
              local_78.iov_len = 4;
              local_68 = session->session_id;
              local_60 = (ulong)session->session_id_len;
              local_58 = session->userauth_host_packet;
              local_50 = session->userauth_host_packet_len;
              local_78.iov_base = local_7d;
              if (local_88 != (LIBSSH2_HOSTKEY_METHOD *)0x0) {
                if ((local_88->signv !=
                     (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_ptr_size_t_ptr_int_iovec_ptr_void_ptr_ptr
                      *)0x0) &&
                   (iVar6 = (*local_88->signv)(session,&local_e0,&local_e8,3,&local_78,&local_d8),
                   iVar6 != 0)) {
                  (*session->free)(session->userauth_host_method,&session->abstract);
                  session->userauth_host_method = (uchar *)0x0;
                  (*session->free)(session->userauth_host_packet,&session->abstract);
                  session->userauth_host_packet = (uchar *)0x0;
                  p_Var3 = pLVar5->dtor;
                  iVar6 = -1;
                  if (p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                    (*p_Var3)(session,&local_d8);
                  }
                  goto LAB_00128fe1;
                }
                p_Var3 = pLVar5->dtor;
                if (p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                  (*p_Var3)(session,&local_d8);
                }
              }
              puVar7 = session->userauth_host_packet;
              if (local_f8 < local_e8) {
                sVar8 = session->userauth_host_method_len +
                        local_e8 + session->userauth_host_packet_len + 0xc;
                if (puVar7 == (uchar *)0x0) {
                  puVar7 = (uchar *)(*session->alloc)(sVar8,&session->abstract);
                }
                else {
                  puVar7 = (uchar *)(*session->realloc)(puVar7,sVar8,&session->abstract);
                }
                if (puVar7 == (uchar *)0x0) {
                  (*session->free)(local_e0,&session->abstract);
                  (*session->free)(session->userauth_host_packet,&session->abstract);
                  session->userauth_host_packet = (uchar *)0x0;
                  (*session->free)(session->userauth_host_method,&session->abstract);
                  session->userauth_host_method = (uchar *)0x0;
                  iVar6 = -6;
                  errmsg = "Failed allocating additional space for userauth-hostbased packet";
                  goto LAB_00128fd9;
                }
                session->userauth_host_packet = puVar7;
              }
              ppuVar4 = local_d0;
              session->userauth_host_s = puVar7 + session->userauth_host_packet_len;
              _libssh2_store_u32(local_d0,(int)local_e8 + (int)session->userauth_host_method_len + 8
                                );
              _libssh2_store_str(ppuVar4,(char *)session->userauth_host_method,
                                 session->userauth_host_method_len);
              (*session->free)(session->userauth_host_method,&session->abstract);
              session->userauth_host_method = (uchar *)0x0;
              _libssh2_store_str(ppuVar4,(char *)local_e0,local_e8);
              (*session->free)(local_e0,&session->abstract);
              session->userauth_host_state = libssh2_NB_state_created;
              goto LAB_00128eb6;
            }
            (*session->free)(session->userauth_host_method,&session->abstract);
            session->userauth_host_method = (uchar *)0x0;
            (*session->free)(session->userauth_host_packet,&session->abstract);
            session->userauth_host_packet = (uchar *)0x0;
          }
          goto LAB_00128fe1;
        }
        puVar7 = *data;
LAB_00128ae4:
        (*session->free)(puVar7,&session->abstract);
        session->userauth_host_data = (uchar *)0x0;
        iVar6 = -0x13;
        errmsg = "Invalid signature for supplied public key, or bad username/public key combination"
        ;
      }
LAB_00128fd9:
      iVar6 = _libssh2_error(session,iVar6,errmsg);
    }
LAB_00128fe1:
    if (iVar6 != -0x25) {
      return iVar6;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar6 = _libssh2_wait_socket(session,start_time);
    if (iVar6 != 0) {
      return iVar6;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_userauth_hostbased_fromfile_ex(LIBSSH2_SESSION *session,
                                       const char *user,
                                       unsigned int user_len,
                                       const char *publickey,
                                       const char *privatekey,
                                       const char *passphrase,
                                       const char *host,
                                       unsigned int host_len,
                                       const char *localuser,
                                       unsigned int localuser_len)
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_hostbased_fromfile(session, user, user_len,
                                             publickey, privatekey,
                                             passphrase, host, host_len,
                                             localuser, localuser_len));
    return rc;
}